

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocs.c
# Opt level: O0

void free_relocs(void)

{
  reloc_s *prVar1;
  reloc_t *next;
  reloc_t *local_8;
  
  local_8 = root;
  while (local_8 != (reloc_t *)0x0) {
    cur = local_8;
    prVar1 = local_8->next;
    free(local_8);
    local_8 = prVar1;
  }
  root = (reloc_t *)0x0;
  cur = (reloc_t *)0x0;
  return;
}

Assistant:

void free_relocs()
{
    reloc_t* next = root;
    while (next)
    {
        cur = next;
        next = cur->next;
        free(cur);
    }
    root = NULL;
    cur = NULL;
}